

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O3

_Bool xdr_reply_decode(XDR *xdrs,rpc_msg *dmsg,int32_t *buf)

{
  reply_body *prVar1;
  anon_union_432_2_d8689e7e_for_ru *paVar2;
  opaque_auth *poVar3;
  u_int *puVar4;
  _Bool _Var5;
  accept_stat aVar6;
  uint *puVar7;
  reply_stat rVar8;
  uint *puVar9;
  undefined8 uVar10;
  uint *puVar11;
  uint32_t *puVar12;
  uint uVar13;
  char *pcVar15;
  char *pcVar16;
  char local_34 [4];
  ulong uVar14;
  
  if (buf == (int32_t *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u non-INLINE","xdr_reply_decode",0x126);
    }
    prVar1 = &(dmsg->ru).RM_rmb;
    puVar7 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar7) {
      _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,&prVar1->rp_stat);
      if (!_Var5) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar16 = "%s:%u ERROR rm_reply.rp_stat";
        _Var5 = false;
        uVar10 = 0x12a;
        goto LAB_00113301;
      }
      rVar8 = prVar1->rp_stat;
    }
    else {
      uVar13 = *(uint *)xdrs->x_data;
      rVar8 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      prVar1->rp_stat = rVar8;
      xdrs->x_data = (uint8_t *)puVar7;
    }
    puVar7 = (uint *)0x0;
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u INLINE","xdr_reply_decode",0x121);
    }
    uVar13 = *buf;
    puVar7 = (uint *)(buf + 1);
    rVar8 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    (dmsg->ru).RM_rmb.rp_stat = rVar8;
  }
  if (rVar8 == MSG_DENIED) {
    if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u MSG_DENIED not verified","xdr_reply_decode",0x16e);
    }
    paVar2 = &(dmsg->ru).RM_rmb.ru;
    if (puVar7 == (uint *)0x0) {
      puVar7 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar7) {
        _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)paVar2);
        if (!_Var5) {
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar16 = "%s:%u ERROR rj_stat";
          _Var5 = false;
          uVar10 = 0x175;
          goto LAB_00113301;
        }
        aVar6 = (paVar2->RP_ar).ar_stat;
      }
      else {
        uVar13 = *(uint *)xdrs->x_data;
        aVar6 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
        (paVar2->RP_ar).ar_stat = aVar6;
        xdrs->x_data = (uint8_t *)puVar7;
      }
      puVar7 = (uint *)0x0;
    }
    else {
      uVar13 = *puVar7;
      puVar7 = puVar7 + 1;
      aVar6 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      (paVar2->RP_ar).ar_stat = aVar6;
    }
    if (aVar6 == PROG_UNAVAIL) {
      if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED AUTH","xdr_reply_decode",0x191);
      }
      if (puVar7 != (uint *)0x0) {
        uVar13 = *puVar7;
        *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4) =
             uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
        return true;
      }
      puVar11 = (uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
      puVar9 = (uint *)xdrs->x_data;
      puVar7 = puVar9 + 1;
      if (puVar7 <= (xdrs->x_v).vio_tail) goto LAB_0011326a;
      _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,puVar11);
      if (_Var5) {
        return true;
      }
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar16 = "%s:%u ERROR rj_why";
      _Var5 = false;
      uVar10 = 0x198;
    }
    else {
      if (aVar6 != SUCCESS) {
        return true;
      }
      if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED MISMATCH","xdr_reply_decode",0x17d);
      }
      if (puVar7 == (uint *)0x0) {
        puVar12 = (uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4);
        puVar7 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_tail < puVar7) {
          _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,puVar12);
          if (!_Var5) {
            if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar16 = "%s:%u ERROR rj_vers.low";
            _Var5 = false;
            uVar10 = 0x183;
            goto LAB_00113301;
          }
        }
        else {
          uVar13 = *(uint *)xdrs->x_data;
          *puVar12 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                     uVar13 << 0x18;
          xdrs->x_data = (uint8_t *)puVar7;
        }
      }
      else {
        uVar13 = *puVar7;
        *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4) =
             uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      }
      puVar11 = (uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
      puVar9 = (uint *)xdrs->x_data;
      puVar7 = puVar9 + 1;
      if (puVar7 <= (xdrs->x_v).vio_tail) {
LAB_0011326a:
        uVar13 = *puVar9;
        *puVar11 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                   uVar13 << 0x18;
        xdrs->x_data = (uint8_t *)puVar7;
        return true;
      }
      _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,puVar11);
      if (_Var5) {
        return true;
      }
      if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar16 = "%s:%u ERROR rj_vers.high";
      _Var5 = false;
      uVar10 = 0x189;
    }
    goto LAB_00113301;
  }
  if (rVar8 != MSG_ACCEPTED) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR dmsg->rm_reply.rp_stat %u","xdr_reply_decode",0x1a2);
    return false;
  }
  if (puVar7 != (uint *)0x0) {
    uVar13 = *puVar7;
    (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_flavor =
         uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    uVar13 = puVar7[1];
    uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    uVar14 = (ulong)uVar13;
    (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length = uVar13;
    goto LAB_00112dce;
  }
  poVar3 = &(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf;
  puVar9 = (uint *)(xdrs->x_v).vio_tail;
  puVar7 = (uint *)((long)xdrs->x_data + 4);
  if (puVar9 < puVar7) {
    _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)poVar3);
    if (_Var5) {
      puVar7 = (uint *)xdrs->x_data;
      puVar9 = (uint *)(xdrs->x_v).vio_tail;
      goto LAB_00112fb1;
    }
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) goto LAB_001132e1;
    pcVar15 = "%s:%u ERROR oa_flavor";
    pcVar16 = "xdr_opaque_auth_decode";
    uVar10 = 0x87;
    goto LAB_001132db;
  }
  uVar13 = *(uint *)xdrs->x_data;
  poVar3->oa_flavor =
       uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  xdrs->x_data = (uint8_t *)puVar7;
LAB_00112fb1:
  puVar4 = &(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
  if (puVar9 < puVar7 + 1) {
    _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,puVar4);
    if (_Var5) {
      uVar14 = (ulong)*puVar4;
      goto LAB_00112dce;
    }
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      pcVar15 = "%s:%u ERROR oa_length";
      pcVar16 = "xdr_opaque_auth_decode";
      uVar10 = 0x8c;
      goto LAB_001132db;
    }
  }
  else {
    uVar13 = *puVar7;
    uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    uVar14 = (ulong)uVar13;
    *puVar4 = uVar13;
    xdrs->x_data = (uint8_t *)(puVar7 + 1);
LAB_00112dce:
    uVar13 = (uint)uVar14;
    if (uVar13 == 0) {
LAB_00112f3b:
      paVar2 = &(dmsg->ru).RM_rmb.ru;
      puVar7 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar7) {
        _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)paVar2);
        if (!_Var5) {
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar16 = "%s:%u ERROR ar_stat";
          _Var5 = false;
          uVar10 = 0x13f;
          goto LAB_00113301;
        }
        aVar6 = (paVar2->RP_ar).ar_stat;
      }
      else {
        uVar13 = *(uint *)xdrs->x_data;
        aVar6 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
        (paVar2->RP_ar).ar_stat = aVar6;
        xdrs->x_data = (uint8_t *)puVar7;
      }
      _Var5 = true;
      if (aVar6 == PROG_MISMATCH) {
        if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u MISMATCH","xdr_reply_decode",0x14d);
        }
        puVar12 = (uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8);
        puVar9 = (uint *)(xdrs->x_v).vio_tail;
        puVar7 = (uint *)((long)xdrs->x_data + 4);
        if (puVar9 < puVar7) {
          _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,puVar12);
          if (!_Var5) {
            if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar16 = "%s:%u ERROR ar_vers.low";
            _Var5 = false;
            uVar10 = 0x151;
            goto LAB_00113301;
          }
          puVar7 = (uint *)xdrs->x_data;
          puVar9 = (uint *)(xdrs->x_v).vio_tail;
        }
        else {
          uVar13 = *(uint *)xdrs->x_data;
          *puVar12 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                     uVar13 << 0x18;
          xdrs->x_data = (uint8_t *)puVar7;
        }
        puVar12 = (uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 0xc);
        if (puVar7 + 1 <= puVar9) {
          uVar13 = *puVar7;
          *puVar12 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                     uVar13 << 0x18;
          xdrs->x_data = (uint8_t *)(puVar7 + 1);
          return true;
        }
        _Var5 = (*xdrs->x_ops->x_getunit)(xdrs,puVar12);
        if (_Var5) {
          return true;
        }
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar16 = "%s:%u ERROR ar_vers.high";
        _Var5 = false;
        uVar10 = 0x157;
      }
      else {
        if (aVar6 != SUCCESS) {
          return true;
        }
        if ((__ntirpc_pkg_params.debug_flags & 0x2000000) == 0) {
          return true;
        }
        pcVar16 = "%s:%u SUCCESS";
        uVar10 = 0x147;
      }
      goto LAB_00113301;
    }
    if (uVar13 < 0x191) {
      _Var5 = (*xdrs->x_ops->x_getbytes)(xdrs,(char *)((long)&(dmsg->ru).RM_rmb.ru + 0x20),uVar13);
      if (_Var5) {
        if (((uVar14 & 3) == 0) ||
           (_Var5 = (*xdrs->x_ops->x_getbytes)(xdrs,local_34,4 - (uVar13 & 3)), _Var5))
        goto LAB_00112f3b;
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          pcVar15 = "%s:%u ERROR crud";
          pcVar16 = "xdr_opaque_decode";
          uVar10 = 0x1c9;
          goto LAB_001132db;
        }
      }
      else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        pcVar15 = "%s:%u ERROR opaque";
        pcVar16 = "xdr_opaque_decode";
        uVar10 = 0x1b9;
LAB_001132db:
        (*__ntirpc_pkg_params.warnx_)(pcVar15,pcVar16,uVar10);
      }
    }
    else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR oa_length (%u) > %u","xdr_opaque_auth_decode_it",0x70,uVar14,400);
    }
  }
LAB_001132e1:
  if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
    return false;
  }
  pcVar16 = "%s:%u ERROR (return)";
  _Var5 = false;
  uVar10 = 0x138;
LAB_00113301:
  (*__ntirpc_pkg_params.warnx_)(pcVar16,"xdr_reply_decode",uVar10);
  return _Var5;
}

Assistant:

bool
xdr_reply_decode(XDR *xdrs, struct rpc_msg *dmsg, int32_t *buf)
{
	if (buf != NULL) {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u INLINE",
			__func__, __LINE__);
		dmsg->rm_reply.rp_stat = IXDR_GET_ENUM(buf, enum_t);
	} else {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u non-INLINE",
			__func__, __LINE__);
		if (!xdr_getenum(xdrs, (enum_t *)&(dmsg->rm_reply.rp_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_reply.rp_stat",
				__func__, __LINE__);
			return (false);
		}
	}

	switch (dmsg->rm_reply.rp_stat) {
	case MSG_ACCEPTED:
	{
		struct accepted_reply *ar = (struct accepted_reply *)
						&(dmsg->rm_reply.ru);

		if (!xdr_opaque_auth_decode(xdrs, &ar->ar_verf, buf)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}

		if (!xdr_getenum(xdrs, (enum_t *)&(ar->ar_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR ar_stat",
				__func__, __LINE__);
			return (false);
		}

		switch (ar->ar_stat) {
		case SUCCESS:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u SUCCESS",
				__func__, __LINE__);
			return (true);

		case PROG_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u MISMATCH",
				__func__, __LINE__);
			if (!xdr_getuint32(xdrs, &(ar->ar_vers.low))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR ar_vers.low",
					__func__, __LINE__);
				return (false);
			}
			if (!xdr_getuint32(xdrs, &(ar->ar_vers.high))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR ar_vers.high",
					__func__, __LINE__);
				return (false);
			}

		case GARBAGE_ARGS:
		case SYSTEM_ERR:
		case PROC_UNAVAIL:
		case PROG_UNAVAIL:
			/* true */
			break;
		default:
			break;
		};	/* ar_stat */
		return (true);
	}	/* MSG_ACCEPTED */
	case MSG_DENIED:
	{
		/* XXX branch not verified */
		struct rejected_reply *rr = (struct rejected_reply *)
						&(dmsg->rm_reply.ru);

		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u MSG_DENIED not verified",
			__func__, __LINE__);

		if (buf != NULL) {
			rr->rj_stat = IXDR_GET_ENUM(buf, enum_t);
		} else if (!xdr_getenum(xdrs, (enum_t *)&(rr->rj_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rj_stat",
				__func__, __LINE__);
			return (false);
		}

		switch (rr->rj_stat) {
		case RPC_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED MISMATCH",
				__func__, __LINE__);
			if (buf != NULL) {
				rr->rj_vers.low = IXDR_GET_U_INT32(buf);
			} else if (!xdr_getuint32(xdrs, &(rr->rj_vers.low))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.low",
					__func__, __LINE__);
				return (false);
			}
			if (!xdr_getuint32(xdrs, &(rr->rj_vers.high))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.high",
					__func__, __LINE__);
				return (false);
			}
			break;

		case AUTH_ERROR:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED AUTH",
				__func__, __LINE__);
			if (buf != NULL) {
				rr->rj_why = IXDR_GET_ENUM(buf, enum_t);
			} else if (!xdr_getenum(xdrs,
					(enum_t *)&(rr->rj_why))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_why",
					__func__, __LINE__);
				return (false);
			}
			break;
		};
		return (true);
	}	/* MSG_DENIED */
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_reply.rp_stat %u",
			__func__, __LINE__,
			dmsg->rm_reply.rp_stat);
		break;
	};	/* rm_reply.rp_stat */

	return (false);
}